

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphContigger.cc
# Opt level: O0

bool __thiscall
GraphContigger::pop_error_bubbble
          (GraphContigger *this,GraphEditor *ge,NodeView *nv1,NodeView *nv2,
          PairedReadsDatastore *peds,int min_support,int max_noise,int snr,bool verbose)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  reference this_00;
  sgNodeID_t sVar5;
  sgNodeID_t sVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  reference pvVar7;
  NodeView *this_01;
  iterator node;
  reference this_02;
  const_reference pvVar8;
  NodeView *in_RCX;
  NodeView *in_RDX;
  int in_R9D;
  NodeView NVar9;
  int in_stack_00000008;
  int in_stack_00000010;
  byte in_stack_00000018;
  vector<long,_std::allocator<long>_> *p_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  *__range1_1;
  vector<long,_std::allocator<long>_> *p;
  iterator __end1;
  iterator __begin1;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  *__range1;
  int vo;
  int v2;
  int v1;
  NodeView *in_stack_00000218;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  *in_stack_fffffffffffffde8;
  __normal_iterator<std::vector<long,_std::allocator<long>_>_*,_std::vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>_>
  *in_stack_fffffffffffffdf0;
  vector<LinkView,_std::allocator<LinkView>_> *in_stack_fffffffffffffe00;
  NodeView *in_stack_fffffffffffffe88;
  vector<NodeView,_std::allocator<NodeView>_> *this_03;
  undefined2 uVar10;
  PairedReadsMapper *in_stack_fffffffffffffed8;
  __normal_iterator<std::vector<long,_std::allocator<long>_>_*,_std::vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>_>
  local_118;
  vector<LinkView,_std::allocator<LinkView>_> local_110;
  NodeView local_f8;
  undefined1 local_e8 [24];
  undefined1 *local_d0;
  reference local_c8;
  vector<long,_std::allocator<long>_> *local_c0;
  GraphEditor *in_stack_ffffffffffffff50;
  NodeView local_98;
  undefined1 local_88 [24];
  undefined1 *local_70;
  int local_68;
  int local_64;
  int local_60;
  vector<NodeView,_std::allocator<NodeView>_> local_50;
  byte local_35;
  int local_34;
  NodeView *local_28;
  NodeView *local_20;
  bool local_1;
  
  local_35 = in_stack_00000018 & 1;
  local_34 = in_R9D;
  local_28 = in_RCX;
  local_20 = in_RDX;
  bVar2 = NodeView::is_bubble_side((NodeView *)in_stack_fffffffffffffed8);
  if (bVar2) {
    this_03 = &local_50;
    NodeView::parallels(in_stack_00000218);
    this_00 = std::vector<NodeView,_std::allocator<NodeView>_>::operator[](this_03,0);
    sVar5 = NodeView::node_id(this_00);
    sVar6 = NodeView::node_id(local_28);
    bVar2 = true;
    if (sVar5 == sVar6) {
      sVar6 = NodeView::node_id(local_20);
      iVar3 = std::abs((int)sVar6);
      sVar6 = NodeView::node_id(local_28);
      iVar4 = std::abs((int)sVar6);
      bVar2 = CONCAT44(extraout_var_00,iVar4) < CONCAT44(extraout_var,iVar3);
    }
    std::vector<NodeView,_std::allocator<NodeView>_>::~vector
              ((vector<NodeView,_std::allocator<NodeView>_> *)in_stack_fffffffffffffe00);
    if (bVar2) {
      local_1 = false;
    }
    else {
      local_60 = 0;
      local_64 = 0;
      local_68 = 0;
      NodeView::prev(in_stack_fffffffffffffe88);
      pvVar7 = std::vector<LinkView,_std::allocator<LinkView>_>::operator[]
                         ((vector<LinkView,_std::allocator<LinkView>_> *)&stack0xffffffffffffff50,0)
      ;
      NVar9 = LinkView::node(pvVar7);
      local_98.dg = NVar9.dg;
      this_01 = (NodeView *)NVar9.id;
      local_98.id = (sgNodeID_t)this_01;
      NodeView::node_id(&local_98);
      PairedReadsMapper::all_paths_fw
                (in_stack_fffffffffffffed8,sVar5,SUB81((ulong)this_03 >> 0x38,0),
                 SUB81((ulong)this_03 >> 0x30,0));
      std::vector<LinkView,_std::allocator<LinkView>_>::~vector(in_stack_fffffffffffffe00);
      local_70 = local_88;
      node = std::
             vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             ::begin(in_stack_fffffffffffffde8);
      local_c0 = (vector<long,_std::allocator<long>_> *)
                 std::
                 vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                 ::end(in_stack_fffffffffffffde8);
      while( true ) {
        bVar2 = __gnu_cxx::operator!=
                          (in_stack_fffffffffffffdf0,
                           (__normal_iterator<std::vector<long,_std::allocator<long>_>_*,_std::vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>_>
                            *)in_stack_fffffffffffffde8);
        uVar10 = (undefined2)((ulong)this_03 >> 0x30);
        if (!bVar2) break;
        local_c8 = __gnu_cxx::
                   __normal_iterator<std::vector<long,_std::allocator<long>_>_*,_std::vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>_>
                   ::operator*((__normal_iterator<std::vector<long,_std::allocator<long>_>_*,_std::vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>_>
                                *)&stack0xffffffffffffff48);
        pvVar8 = std::vector<long,_std::allocator<long>_>::operator[](local_c8,0);
        lVar1 = *pvVar8;
        sVar6 = NodeView::node_id(local_20);
        if (lVar1 == sVar6) {
          local_60 = local_60 + 1;
        }
        else {
          pvVar8 = std::vector<long,_std::allocator<long>_>::operator[](local_c8,0);
          lVar1 = *pvVar8;
          sVar6 = NodeView::node_id(local_28);
          if (lVar1 == sVar6) {
            local_64 = local_64 + 1;
          }
          else {
            local_68 = local_68 + 1;
          }
        }
        __gnu_cxx::
        __normal_iterator<std::vector<long,_std::allocator<long>_>_*,_std::vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>_>
        ::operator++((__normal_iterator<std::vector<long,_std::allocator<long>_>_*,_std::vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>_>
                      *)&stack0xffffffffffffff48);
      }
      std::
      vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
      ::~vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                 *)in_stack_fffffffffffffe00);
      NodeView::next(this_01);
      pvVar7 = std::vector<LinkView,_std::allocator<LinkView>_>::operator[](&local_110,0);
      local_f8 = LinkView::node(pvVar7);
      NodeView::node_id(&local_f8);
      PairedReadsMapper::all_paths_fw
                (in_stack_fffffffffffffed8,sVar5,SUB21((ushort)uVar10 >> 8,0),SUB21(uVar10,0));
      std::vector<LinkView,_std::allocator<LinkView>_>::~vector(in_stack_fffffffffffffe00);
      local_d0 = local_e8;
      local_118._M_current =
           (vector<long,_std::allocator<long>_> *)
           std::
           vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
           ::begin(in_stack_fffffffffffffde8);
      std::
      vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
      ::end(in_stack_fffffffffffffde8);
      while( true ) {
        bVar2 = __gnu_cxx::operator!=
                          (in_stack_fffffffffffffdf0,
                           (__normal_iterator<std::vector<long,_std::allocator<long>_>_*,_std::vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>_>
                            *)in_stack_fffffffffffffde8);
        if (!bVar2) break;
        this_02 = __gnu_cxx::
                  __normal_iterator<std::vector<long,_std::allocator<long>_>_*,_std::vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>_>
                  ::operator*(&local_118);
        pvVar8 = std::vector<long,_std::allocator<long>_>::operator[](this_02,0);
        lVar1 = *pvVar8;
        sVar5 = NodeView::node_id(local_20);
        if (lVar1 == -sVar5) {
          local_60 = local_60 + 1;
        }
        else {
          pvVar8 = std::vector<long,_std::allocator<long>_>::operator[](this_02,0);
          in_stack_fffffffffffffe00 = (vector<LinkView,_std::allocator<LinkView>_> *)*pvVar8;
          sVar5 = NodeView::node_id(local_28);
          if (in_stack_fffffffffffffe00 == (vector<LinkView,_std::allocator<LinkView>_> *)-sVar5) {
            local_64 = local_64 + 1;
          }
          else {
            local_68 = local_68 + 1;
          }
        }
        __gnu_cxx::
        __normal_iterator<std::vector<long,_std::allocator<long>_>_*,_std::vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>_>
        ::operator++(&local_118);
      }
      std::
      vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
      ::~vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                 *)in_stack_fffffffffffffe00);
      if (((local_34 < local_60) && (local_64 + local_68 < in_stack_00000008)) &&
         (in_stack_00000010 * (local_64 + local_68) <= local_60)) {
        NodeView::node_id(local_28);
        GraphEditor::queue_node_deletion(in_stack_ffffffffffffff50,(sgNodeID_t)node._M_current);
        local_1 = true;
      }
      else if (((local_34 < local_64) && (local_60 + local_68 < in_stack_00000008)) &&
              (in_stack_00000010 * (local_60 + local_68) <= local_64)) {
        NodeView::node_id(local_20);
        GraphEditor::queue_node_deletion(in_stack_ffffffffffffff50,(sgNodeID_t)node._M_current);
        local_1 = true;
      }
      else {
        local_1 = false;
      }
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool GraphContigger::pop_error_bubbble(GraphEditor& ge, NodeView &nv1, NodeView &nv2, PairedReadsDatastore& peds, int min_support, int max_noise, int snr, bool verbose) {
//    auto nv1(_nv1);
//    auto nv2(_nv2);
    if (!nv1.is_bubble_side()) return false;

    if (nv1.parallels()[0].node_id() != nv2.node_id() or std::abs(nv1.node_id())>std::abs(nv2.node_id())) return false;
    int v1=0;
    int v2=0;
    int vo=0;
    for (const auto&p: peds.mapper.all_paths_fw(nv1.prev()[0].node().node_id(), false)) {
        if (p[0] == nv1.node_id()){
            v1++;
        } else if (p[0] == nv2.node_id()) {
            v2++;
        } else{
            vo++;
        }
    }
    for (const auto &p: peds.mapper.all_paths_fw(-nv1.next()[0].node().node_id(), false)) {
        if (p[0] == -nv1.node_id()) {
            v1++;
        } else if (p[0] == -nv2.node_id()) {
            v2++;
        } else {
            vo++;
        }
    }
    if (v1>min_support and v2+vo<max_noise and v1>=snr*(v2+vo)) {
        ge.queue_node_deletion(nv2.node_id());
        return true;
    }
    if (v2>min_support and v1+vo<max_noise and v2>=snr*(v1+vo)) {
        ge.queue_node_deletion(nv1.node_id());
        return true;
    }
    return false;
}